

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void testing::internal::DeathTestAbort(string *message)

{
  InternalRunDeathTestFlag *pIVar1;
  DeathTestFactory *pDVar2;
  FILE *__stream;
  uint in_ECX;
  undefined8 extraout_RDX;
  FILE *pFVar3;
  undefined8 uVar4;
  undefined8 in_R8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  MStack_58;
  string *psStack_40;
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
    fputs((message->_M_dataplus)._M_p,_stderr);
    fflush(_stderr);
    posix::Abort();
  }
  __stream = (FILE *)posix::FDOpen(pIVar1->write_fd_,"w");
  fputc(0x49,__stream);
  pFVar3 = __stream;
  fputs((message->_M_dataplus)._M_p,__stream);
  fflush(__stream);
  uVar4 = 1;
  _Exit(1);
  psStack_40 = message;
  UnitTest::GetInstance();
  pDVar2 = ((UnitTest::GetInstance::instance.impl_)->death_test_factory_)._M_t.
           super___uniq_ptr_impl<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::DeathTestFactory_*,_std::default_delete<testing::internal::DeathTestFactory>_>
           .super__Head_base<0UL,_testing::internal::DeathTestFactory_*,_false>._M_head_impl;
  MStack_58.vtable_ = (VTable *)pFVar3->_IO_read_ptr;
  MStack_58.buffer_ = (Buffer)pFVar3->_IO_read_end;
  pFVar3->_IO_read_ptr = (char *)0x0;
  MStack_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001e9748;
  (*pDVar2->_vptr_DeathTestFactory[2])(pDVar2,uVar4,&MStack_58,extraout_RDX,(ulong)in_ECX,in_R8);
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&MStack_58);
  return;
}

Assistant:

[[noreturn]] static void DeathTestAbort(const std::string& message) {
  // On a POSIX system, this function may be called from a threadsafe-style
  // death test child process, which operates on a very small stack.  Use
  // the heap for any additional non-minuscule memory requirements.
  const InternalRunDeathTestFlag* const flag =
      GetUnitTestImpl()->internal_run_death_test_flag();
  if (flag != nullptr) {
    FILE* parent = posix::FDOpen(flag->write_fd(), "w");
    fputc(kDeathTestInternalError, parent);
    fprintf(parent, "%s", message.c_str());
    fflush(parent);
    _Exit(1);
  } else {
    fprintf(stderr, "%s", message.c_str());
    fflush(stderr);
    posix::Abort();
  }
}